

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O0

bool __thiscall
burst::
merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
::equal(merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
        *this,merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
              *that)

{
  type_conflict4 tVar1;
  bool bVar2;
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  local_78;
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  local_60;
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  local_48;
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  local_30;
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  *local_18;
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  *that_local;
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  *this_local;
  
  local_18 = that;
  that_local = this;
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&,_long>
                      *)this,(iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&,_long>
                              *)that);
  if (!tVar1) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/merge_iterator.hpp"
                  ,0x94,
                  "bool burst::merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int>>>>>::equal(const merge_iterator<RandomAccessIterator, Compare> &) const [RandomAccessIterator = burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int>>>>, Compare = std::less<void>]"
                 );
  }
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  ::owning_iterator(&local_30,&this->m_begin);
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  ::owning_iterator(&local_48,&this->m_end);
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  ::owning_iterator(&local_60,&local_18->m_begin);
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  ::owning_iterator(&local_78,&local_18->m_end);
  bVar2 = std::
          equal<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,std::allocator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>>>,burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,std::allocator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>>>>
                    (&local_30,&local_48,&local_60,&local_78);
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  ::~owning_iterator(&local_78);
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  ::~owning_iterator(&local_60);
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  ::~owning_iterator(&local_48);
  owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>
  ::~owning_iterator(&local_30);
  return bVar2;
}

Assistant:

bool equal (const merge_iterator & that) const
        {
            assert(this->m_begin == that.m_begin);
            return std::equal(this->m_begin, this->m_end, that.m_begin, that.m_end);
        }